

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O0

void __thiscall amrex::FabArrayBase::flushPolarB(FabArrayBase *this,bool no_assertion)

{
  bool bVar1;
  pointer ppVar2;
  byte in_SIL;
  _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_> it;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>_>
  er_it;
  key_type *in_stack_ffffffffffffffa8;
  multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>_>
  *in_stack_ffffffffffffffb0;
  PolarB *this_00;
  multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>_>
  *in_stack_ffffffffffffffb8;
  const_iterator in_stack_ffffffffffffffc0;
  const_iterator in_stack_ffffffffffffffc8;
  _Self local_30;
  pair<std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>,_std::_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>_>
  local_28;
  byte local_11 [9];
  byte *local_8;
  
  local_11[0] = in_SIL & 1;
  local_8 = local_11;
  local_28 = std::
             multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>_>
             ::equal_range(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_30._M_node = local_28.first._M_node;
  while( true ) {
    bVar1 = std::operator!=(&local_30,&local_28.second);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>
                           *)0x100c87b);
    this_00 = ppVar2->second;
    if (this_00 != (PolarB *)0x0) {
      PolarB::~PolarB((PolarB *)0x100c894);
      operator_delete(this_00,0x48);
    }
    std::
    _Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>::
    operator++((_Rb_tree_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>
                *)this_00);
  }
  std::
  _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>
  ::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>
              *)&stack0xffffffffffffffc8,&local_28.first);
  std::
  _Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>
  ::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>
              *)&stack0xffffffffffffffc0,&local_28.second);
  std::
  multimap<amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*,_std::less<amrex::FabArrayBase::BDKey>,_std::allocator<std::pair<const_amrex::FabArrayBase::BDKey,_amrex::FabArrayBase::PolarB_*>_>_>
  ::erase(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void
FabArrayBase::flushPolarB (bool no_assertion) const
{
    amrex::ignore_unused(no_assertion);
    AMREX_ASSERT(no_assertion || getBDKey() == m_bdkey);
    auto er_it = m_ThePolarBCache.equal_range(m_bdkey);
    for (auto it = er_it.first; it != er_it.second; ++it) {
        delete it->second;
    }
    m_ThePolarBCache.erase(er_it.first, er_it.second);
}